

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_setopt(Curl_multi *multi,CURLMoption option,...)

{
  CURLMcode CVar1;
  byte local_a8;
  undefined7 uStack_a7;
  va_list param;
  
  CVar1 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    if (multi->in_callback == false) {
      CVar1 = CURLM_OK;
      switch(option) {
      case CURLMOPT_PIPELINING:
        multi->multiplexing = (_Bool)(local_a8 >> 1 & 1);
        break;
      case CURLMOPT_MAXCONNECTS:
        multi->maxconnects = CONCAT71(uStack_a7,local_a8);
        break;
      case CURLMOPT_MAX_HOST_CONNECTIONS:
        multi->max_host_connections = CONCAT71(uStack_a7,local_a8);
        break;
      case CURLMOPT_MAX_PIPELINE_LENGTH:
        break;
      case CURLMOPT_MAX_TOTAL_CONNECTIONS:
        multi->max_total_connections = CONCAT71(uStack_a7,local_a8);
        break;
      default:
        if (option - CURLMOPT_PIPELINING_SITE_BL < 2) {
          return CURLM_OK;
        }
        if (option - CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE < 2) {
          return CURLM_OK;
        }
        if (option == CURLMOPT_SOCKETDATA) {
          multi->socket_userp = (void *)CONCAT71(uStack_a7,local_a8);
          return CURLM_OK;
        }
        if (option == CURLMOPT_TIMERDATA) {
          multi->timer_userp = (void *)CONCAT71(uStack_a7,local_a8);
          return CURLM_OK;
        }
        if (option == CURLMOPT_PUSHDATA) {
          multi->push_userp = (void *)CONCAT71(uStack_a7,local_a8);
          return CURLM_OK;
        }
        if (option == CURLMOPT_PUSHFUNCTION) {
          multi->push_cb = (curl_push_callback)CONCAT71(uStack_a7,local_a8);
          return CURLM_OK;
        }
        if (option == CURLMOPT_TIMERFUNCTION) {
          multi->timer_cb = (curl_multi_timer_callback)CONCAT71(uStack_a7,local_a8);
          return CURLM_OK;
        }
        if (option == CURLMOPT_SOCKETFUNCTION) {
          multi->socket_cb = (curl_socket_callback)CONCAT71(uStack_a7,local_a8);
          return CURLM_OK;
        }
      case 4:
      case 5:
      case 9:
      case 10:
      case CURLMOPT_MAX_PIPELINE_LENGTH|CURLMOPT_PIPELINING:
      case 0xc:
        CVar1 = CURLM_UNKNOWN_OPTION;
      }
    }
    else {
      CVar1 = CURLM_RECURSIVE_API_CALL;
    }
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_setopt(struct Curl_multi *multi,
                            CURLMoption option, ...)
{
  CURLMcode res = CURLM_OK;
  va_list param;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  va_start(param, option);

  switch(option) {
  case CURLMOPT_SOCKETFUNCTION:
    multi->socket_cb = va_arg(param, curl_socket_callback);
    break;
  case CURLMOPT_SOCKETDATA:
    multi->socket_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PUSHFUNCTION:
    multi->push_cb = va_arg(param, curl_push_callback);
    break;
  case CURLMOPT_PUSHDATA:
    multi->push_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PIPELINING:
    multi->multiplexing = va_arg(param, long) & CURLPIPE_MULTIPLEX;
    break;
  case CURLMOPT_TIMERFUNCTION:
    multi->timer_cb = va_arg(param, curl_multi_timer_callback);
    break;
  case CURLMOPT_TIMERDATA:
    multi->timer_userp = va_arg(param, void *);
    break;
  case CURLMOPT_MAXCONNECTS:
    multi->maxconnects = va_arg(param, long);
    break;
  case CURLMOPT_MAX_HOST_CONNECTIONS:
    multi->max_host_connections = va_arg(param, long);
    break;
  case CURLMOPT_MAX_TOTAL_CONNECTIONS:
    multi->max_total_connections = va_arg(param, long);
    break;
    /* options formerly used for pipelining */
  case CURLMOPT_MAX_PIPELINE_LENGTH:
    break;
  case CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE:
    break;
  case CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE:
    break;
  case CURLMOPT_PIPELINING_SITE_BL:
    break;
  case CURLMOPT_PIPELINING_SERVER_BL:
    break;
  default:
    res = CURLM_UNKNOWN_OPTION;
    break;
  }
  va_end(param);
  return res;
}